

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.c
# Opt level: O0

ZyanStatus
ZydisFormatterSetHook(ZydisFormatter *formatter,ZydisFormatterFunction type,void **callback)

{
  ZydisFormatterFunc *pp_Var1;
  ZydisFormatterFunc p_Var2;
  ZyanUPointer *test;
  void *temp;
  void **callback_local;
  ZydisFormatterFunction type_local;
  ZydisFormatter *formatter_local;
  
  if (((formatter == (ZydisFormatter *)0x0) || (callback == (void **)0x0)) ||
     (ZYDIS_FORMATTER_FUNC_MAX_VALUE < type)) {
    formatter_local._4_4_ = 0x80100004;
  }
  else {
    p_Var2 = (ZydisFormatterFunc)*callback;
    pp_Var1 = &formatter->func_pre_instruction + type;
    switch(type) {
    case ZYDIS_FORMATTER_FUNC_PRE_INSTRUCTION:
      if (pp_Var1 != &formatter->func_pre_instruction) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_pre_instruction",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,399,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case ZYDIS_FORMATTER_FUNC_POST_INSTRUCTION:
      if (pp_Var1 != &formatter->func_post_instruction) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_post_instruction",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x191,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case ZYDIS_FORMATTER_FUNC_FORMAT_INSTRUCTION:
      if (pp_Var1 != &formatter->func_format_instruction) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_format_instruction",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x193,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case ZYDIS_FORMATTER_FUNC_PRE_OPERAND:
      if (pp_Var1 != &formatter->func_pre_operand) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_pre_operand",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x195,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case ZYDIS_FORMATTER_FUNC_POST_OPERAND:
      if (pp_Var1 != &formatter->func_post_operand) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_post_operand",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x197,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case ZYDIS_FORMATTER_FUNC_FORMAT_OPERAND_REG:
      if (pp_Var1 != &formatter->func_format_operand_reg) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_format_operand_reg",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x199,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case ZYDIS_FORMATTER_FUNC_FORMAT_OPERAND_MEM:
      if (pp_Var1 != &formatter->func_format_operand_mem) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_format_operand_mem",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x19b,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case ZYDIS_FORMATTER_FUNC_FORMAT_OPERAND_PTR:
      if (pp_Var1 != &formatter->func_format_operand_ptr) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_format_operand_ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x19d,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case ZYDIS_FORMATTER_FUNC_FORMAT_OPERAND_IMM:
      if (pp_Var1 != &formatter->func_format_operand_imm) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_format_operand_imm",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x19f,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case ZYDIS_FORMATTER_FUNC_PRINT_MNEMONIC:
      if (pp_Var1 != &formatter->func_print_mnemonic) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_print_mnemonic",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x1a1,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case ZYDIS_FORMATTER_FUNC_PRINT_REGISTER:
      if ((ZydisFormatterRegisterFunc *)pp_Var1 != &formatter->func_print_register) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_print_register",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x1a3,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case ZYDIS_FORMATTER_FUNC_PRINT_ADDRESS_ABS:
      if (pp_Var1 != &formatter->func_print_address_abs) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_print_address_abs",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x1a5,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case ZYDIS_FORMATTER_FUNC_PRINT_ADDRESS_REL:
      if (pp_Var1 != &formatter->func_print_address_rel) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_print_address_rel",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x1a7,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case ZYDIS_FORMATTER_FUNC_PRINT_DISP:
      if (pp_Var1 != &formatter->func_print_disp) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_print_disp",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x1a9,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case ZYDIS_FORMATTER_FUNC_PRINT_IMM:
      if (pp_Var1 != &formatter->func_print_imm) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_print_imm",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x1ab,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case ZYDIS_FORMATTER_FUNC_PRINT_TYPECAST:
      if (pp_Var1 != &formatter->func_print_typecast) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_print_typecast",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x1ad,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case ZYDIS_FORMATTER_FUNC_PRINT_SEGMENT:
      if (pp_Var1 != &formatter->func_print_segment) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_print_segment",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x1af,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case ZYDIS_FORMATTER_FUNC_PRINT_PREFIXES:
      if (pp_Var1 != &formatter->func_print_prefixes) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_print_prefixes",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x1b1,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case ZYDIS_FORMATTER_FUNC_MAX_VALUE:
      if ((ZydisFormatterDecoratorFunc *)pp_Var1 != &formatter->func_print_decorator) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_print_decorator",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x1b3,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                    ,0x1b5,
                    "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                   );
    }
    *callback = (&formatter->func_pre_instruction)[type];
    if (p_Var2 == (ZydisFormatterFunc)0x0) {
      formatter_local._4_4_ = 0x100000;
    }
    else {
      (&formatter->func_pre_instruction)[type] = p_Var2;
      formatter_local._4_4_ = 0x100000;
    }
  }
  return formatter_local._4_4_;
}

Assistant:

ZyanStatus ZydisFormatterSetHook(ZydisFormatter* formatter, ZydisFormatterFunction type,
    const void** callback)
{
    if (!formatter || !callback || ((ZyanUSize)type > ZYDIS_FORMATTER_FUNC_MAX_VALUE))
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    const void* const temp = *callback;

    // The following code relies on the order of the enum values and the function fields inside
    // the `ZydisFormatter` struct

#ifdef ZYAN_DEBUG
    const ZyanUPointer* test = (ZyanUPointer*)(&formatter->func_pre_instruction + type);
    switch (type)
    {
    case ZYDIS_FORMATTER_FUNC_PRE_INSTRUCTION:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_pre_instruction   ); break;
    case ZYDIS_FORMATTER_FUNC_POST_INSTRUCTION:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_post_instruction  ); break;
    case ZYDIS_FORMATTER_FUNC_FORMAT_INSTRUCTION:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_format_instruction); break;
    case ZYDIS_FORMATTER_FUNC_PRE_OPERAND:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_pre_operand       ); break;
    case ZYDIS_FORMATTER_FUNC_POST_OPERAND:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_post_operand      ); break;
    case ZYDIS_FORMATTER_FUNC_FORMAT_OPERAND_REG:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_format_operand_reg); break;
    case ZYDIS_FORMATTER_FUNC_FORMAT_OPERAND_MEM:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_format_operand_mem); break;
    case ZYDIS_FORMATTER_FUNC_FORMAT_OPERAND_PTR:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_format_operand_ptr); break;
    case ZYDIS_FORMATTER_FUNC_FORMAT_OPERAND_IMM:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_format_operand_imm); break;
    case ZYDIS_FORMATTER_FUNC_PRINT_MNEMONIC:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_print_mnemonic    ); break;
    case ZYDIS_FORMATTER_FUNC_PRINT_REGISTER:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_print_register    ); break;
    case ZYDIS_FORMATTER_FUNC_PRINT_ADDRESS_ABS:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_print_address_abs ); break;
    case ZYDIS_FORMATTER_FUNC_PRINT_ADDRESS_REL:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_print_address_rel ); break;
    case ZYDIS_FORMATTER_FUNC_PRINT_DISP:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_print_disp        ); break;
    case ZYDIS_FORMATTER_FUNC_PRINT_IMM:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_print_imm         ); break;
    case ZYDIS_FORMATTER_FUNC_PRINT_TYPECAST:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_print_typecast    ); break;
    case ZYDIS_FORMATTER_FUNC_PRINT_SEGMENT:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_print_segment     ); break;
    case ZYDIS_FORMATTER_FUNC_PRINT_PREFIXES:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_print_prefixes    ); break;
    case ZYDIS_FORMATTER_FUNC_PRINT_DECORATOR:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_print_decorator   ); break;
    default:
        ZYAN_UNREACHABLE;
    }
#endif

    *callback = *(const void**)(&formatter->func_pre_instruction + type);
    if (!temp)
    {
        return ZYAN_STATUS_SUCCESS;
    }
    ZYAN_MEMCPY(&formatter->func_pre_instruction + type, &temp, sizeof(ZyanUPointer));

    return ZYAN_STATUS_SUCCESS;
}